

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall
JsrtDebugManager::GetBreakpoints
          (JsrtDebugManager *this,JavascriptArray **bpsArray,ScriptContext *scriptContext)

{
  uint uVar1;
  ScriptContext *scriptContext_00;
  ProbeList *pPVar2;
  Probe *pPVar3;
  JavascriptArray *instance;
  code *pcVar4;
  bool bVar5;
  DebugContext *pDVar6;
  undefined4 *puVar7;
  DynamicObject *object;
  Var value;
  uint64 uVar8;
  uint64 uVar9;
  Var index;
  long lVar10;
  double value_00;
  
  scriptContext_00 =
       ((((((*bpsArray)->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pDVar6 = Js::ScriptContext::GetDebugContext(scriptContext);
  pPVar2 = pDVar6->diagProbesContainer->diagProbeList;
  if (0 < (pPVar2->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count)
  {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar10 = 0;
    do {
      pPVar3 = (pPVar2->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
               buffer[lVar10];
      object = Js::JavascriptLibrary::CreateObject
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
      JsrtDebugUtils::AddPropertyToObject
                (object,(JsrtDebugPropertyId)0x1,
                 *(uint32 *)&pPVar3[4].super_HaltCallback._vptr_HaltCallback,scriptContext);
      JsrtDebugUtils::AddLineColumnToObject
                (object,(FunctionBody *)pPVar3[3].super_HaltCallback._vptr_HaltCallback,
                 *(int *)((long)&pPVar3[1].super_HaltCallback._vptr_HaltCallback + 4));
      JsrtDebugUtils::AddScriptIdToObject
                (object,(Utf8SourceInfo *)pPVar3[2].super_HaltCallback._vptr_HaltCallback[1]);
      value = Js::CrossSite::MarshalVar(scriptContext_00,object,false);
      instance = *bpsArray;
      uVar1 = (instance->super_ArrayObject).length;
      if ((long)(int)uVar1 < 0) {
        value_00 = (double)uVar1;
        uVar8 = Js::NumberUtilities::ToSpecial(value_00);
        bVar5 = Js::NumberUtilities::IsNan(value_00);
        if (bVar5) {
          uVar9 = Js::NumberUtilities::ToSpecial(value_00);
          if (uVar9 != 0xfff8000000000000) {
            uVar9 = Js::NumberUtilities::ToSpecial(value_00);
            if (uVar9 != 0x7ff8000000000000) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/JavascriptNumber.inl"
                                 ,0xa2,
                                 "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                 ,"We should only produce a NaN with this value");
              if (!bVar5) {
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar7 = 0;
            }
          }
        }
        index = (Var)(uVar8 ^ 0xfffc000000000000);
      }
      else {
        index = (Var)((long)(int)uVar1 | 0x1000000000000);
      }
      Js::JavascriptOperators::OP_SetElementI
                (instance,index,value,scriptContext_00,PropertyOperation_None);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (pPVar2->
                      super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                      count);
  }
  return;
}

Assistant:

void JsrtDebugManager::GetBreakpoints(Js::JavascriptArray** bpsArray, Js::ScriptContext* scriptContext)
{
    Js::ScriptContext* arrayScriptContext = (*bpsArray)->GetScriptContext();
    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    probeContainer->MapProbes([&](int i, Js::Probe* pProbe)
    {
        Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
        Js::DynamicObject* bpObject = scriptContext->GetLibrary()->CreateObject();

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, bp->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, bp->GetFunctionBody(), bp->GetBytecodeOffset());

        Js::Utf8SourceInfo* utf8SourceInfo = bp->GetDbugDocument()->GetUtf8SourceInfo();
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        Js::Var marshaledObj = Js::CrossSite::MarshalVar(arrayScriptContext, bpObject);
        Js::JavascriptOperators::OP_SetElementI((Js::Var)(*bpsArray), Js::JavascriptNumber::ToVar((*bpsArray)->GetLength(), arrayScriptContext), marshaledObj, arrayScriptContext);
    });
}